

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.hpp
# Opt level: O0

ArgumentMismatch *
CLI::ArgumentMismatch::PartialType
          (ArgumentMismatch *__return_storage_ptr__,string *name,int num,string *type)

{
  string local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  string *local_28;
  string *type_local;
  string *psStack_18;
  int num_local;
  string *name_local;
  
  local_28 = type;
  type_local._4_4_ = num;
  psStack_18 = name;
  name_local = (string *)__return_storage_ptr__;
  ::std::operator+(&local_c8,name,": ");
  ::std::operator+(&local_a8,&local_c8,type);
  ::std::operator+(&local_88,&local_a8," only partially specified: ");
  std::__cxx11::to_string(&local_f8,type_local._4_4_);
  ::std::operator+(&local_68,&local_88,&local_f8);
  ::std::operator+(&local_48,&local_68," required for each element");
  ArgumentMismatch(__return_storage_ptr__,&local_48);
  ::std::__cxx11::string::~string((string *)&local_48);
  ::std::__cxx11::string::~string((string *)&local_68);
  ::std::__cxx11::string::~string((string *)&local_f8);
  ::std::__cxx11::string::~string((string *)&local_88);
  ::std::__cxx11::string::~string((string *)&local_a8);
  ::std::__cxx11::string::~string((string *)&local_c8);
  return __return_storage_ptr__;
}

Assistant:

static ArgumentMismatch PartialType(std::string name, int num, std::string type) {
        return ArgumentMismatch(name + ": " + type + " only partially specified: " + std::to_string(num) +
                                " required for each element");
    }